

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

ON_wString __thiscall
ON_wString::EncodeXMLValue(ON_wString *this,bool bEncodeCodePointsAboveBasicLatin)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  byte in_DL;
  undefined7 in_register_00000031;
  ON_wString *this_00;
  int encoded_length;
  uint h;
  uint hex_digit_count_1;
  int decoded_wchar_count_1;
  ON__UINT32 u_1;
  wchar_t *buffer1_1;
  wchar_t *local_90;
  wchar_t *encoded;
  ON_wString s;
  uint hex_digit_count;
  int decoded_wchar_count;
  ON__UINT32 u;
  wchar_t c;
  wchar_t *buffer1;
  ON_UnicodeErrorParameters e;
  int length1;
  wchar_t *buffer0_end;
  uint local_48;
  uint hex_digit_capacity;
  uint hex_digits [8];
  wchar_t *buffer0;
  int length0;
  bool bEncodeCodePointsAboveBasicLatin_local;
  ON_wString *this_local;
  
  this_00 = (ON_wString *)CONCAT71(in_register_00000031,bEncodeCodePointsAboveBasicLatin);
  iVar1 = Length(this_00);
  if (iVar1 < 1) {
    ON_wString(this,&EmptyString);
  }
  else {
    hex_digits._24_8_ = Array(this_00);
    if ((wchar_t *)hex_digits._24_8_ == (wchar_t *)0x0) {
      ON_wString(this,&EmptyString);
    }
    else {
      memset(&local_48,0,0x20);
      register0x00000000 = (wchar_t *)(hex_digits._24_8_ + (long)iVar1 * 4);
      e.m_error_mask = 0;
      for (_u = (wchar_t *)hex_digits._24_8_; _u < stack0xffffffffffffffa8; _u = _u + 1) {
        decoded_wchar_count = *_u;
        switch(decoded_wchar_count) {
        case 0x22:
          e.m_error_mask = e.m_error_mask + 5;
          break;
        default:
          if (((in_DL & 1) != 0) &&
             ((decoded_wchar_count < L'\0' || (L'\x7f' < decoded_wchar_count)))) {
            buffer1 = (wchar_t *)ON_UnicodeErrorParameters::MaskErrors._0_8_;
            e.m_error_status = ON_UnicodeErrorParameters::MaskErrors.m_error_code_point;
            hex_digit_count = 0xfffd;
            s.m_s._4_4_ = ON_DecodeWideChar(_u,(int)((long)stack0xffffffffffffffa8 - (long)_u >> 2),
                                            (ON_UnicodeErrorParameters *)&buffer1,&hex_digit_count);
            if ((0 < s.m_s._4_4_) &&
               ((iVar2 = ON_IsValidUnicodeCodePoint(hex_digit_count), iVar2 != 0 &&
                (s.m_s._0_4_ = Internal_ToHexDigits(hex_digit_count,&local_48,8), (uint)s.m_s != 0))
               )) {
              e.m_error_mask = (uint)s.m_s + e.m_error_mask + 3;
              _u = _u + (s.m_s._4_4_ + -1);
            }
          }
          break;
        case 0x26:
          e.m_error_mask = e.m_error_mask + 4;
          break;
        case 0x27:
          e.m_error_mask = e.m_error_mask + 5;
          break;
        case 0x3c:
          e.m_error_mask = e.m_error_mask + 3;
          break;
        case 0x3e:
          e.m_error_mask = e.m_error_mask + 3;
        }
        e.m_error_mask = e.m_error_mask + 1;
      }
      if (iVar1 < (int)e.m_error_mask) {
        ON_wString((ON_wString *)&encoded);
        local_90 = ReserveArray((ON_wString *)&encoded,(long)(int)e.m_error_mask);
        if (local_90 == (wchar_t *)0x0) {
          ON_wString(this,&EmptyString);
        }
        else {
          for (_decoded_wchar_count_1 = (wchar_t *)hex_digits._24_8_; pwVar5 = local_90,
              _decoded_wchar_count_1 < stack0xffffffffffffffa8;
              _decoded_wchar_count_1 = _decoded_wchar_count_1 + 1) {
            *local_90 = *_decoded_wchar_count_1;
            switch(*local_90) {
            case L'\"':
              builtin_wcsncpy(local_90,L"&quot;",6);
              local_90 = local_90 + 6;
              break;
            default:
              if (((in_DL & 1) != 0) && ((*local_90 < L'\0' || (L'\x7f' < *local_90)))) {
                e.m_error_status = ON_UnicodeErrorParameters::MaskErrors.m_error_code_point;
                buffer1 = (wchar_t *)ON_UnicodeErrorParameters::MaskErrors._0_8_;
                hex_digit_count_1 = 0xfffd;
                iVar1 = ON_DecodeWideChar(_decoded_wchar_count_1,
                                          (int)((ulong)((long)stack0xffffffffffffffa8 -
                                                       (long)_decoded_wchar_count_1) >> 2),
                                          (ON_UnicodeErrorParameters *)&buffer1,&hex_digit_count_1);
                if ((0 < iVar1) &&
                   ((iVar2 = ON_IsValidUnicodeCodePoint(hex_digit_count_1), iVar2 != 0 &&
                    (encoded_length = Internal_ToHexDigits(hex_digit_count_1,&local_48,8),
                    encoded_length != 0)))) {
                  *local_90 = L'&';
                  pwVar5 = local_90 + 2;
                  local_90[1] = L'#';
                  local_90 = local_90 + 3;
                  *pwVar5 = L'x';
                  while (encoded_length != 0) {
                    encoded_length = encoded_length - 1;
                    uVar3 = (&local_48)[(uint)encoded_length];
                    if (uVar3 < 10) {
                      *local_90 = uVar3 + L'0';
                    }
                    else {
                      *local_90 = uVar3 + L'W';
                    }
                    local_90 = local_90 + 1;
                  }
                  *local_90 = L';';
                  _decoded_wchar_count_1 = _decoded_wchar_count_1 + (iVar1 + -1);
                }
              }
              local_90 = local_90 + 1;
              break;
            case L'&':
              builtin_wcsncpy(local_90,L"&amp;",5);
              local_90 = local_90 + 5;
              break;
            case L'\'':
              builtin_wcsncpy(local_90,L"&apos;",6);
              local_90 = local_90 + 6;
              break;
            case L'<':
              builtin_wcsncpy(local_90,L"&lt;",4);
              local_90 = local_90 + 4;
              break;
            case L'>':
              builtin_wcsncpy(local_90,L"&gt;",4);
              local_90 = local_90 + 4;
            }
          }
          *local_90 = L'\0';
          pwVar4 = Array((ON_wString *)&encoded);
          uVar3 = (uint)((long)pwVar5 - (long)pwVar4 >> 2);
          if (uVar3 == e.m_error_mask) {
            SetLength((ON_wString *)&encoded,(long)(int)uVar3);
            ON_wString(this,(ON_wString *)&encoded);
          }
          else {
            ON_wString(this,&EmptyString);
          }
        }
        buffer1_1._0_4_ = 1;
        ~ON_wString((ON_wString *)&encoded);
      }
      else {
        ON_wString(this,this_00);
      }
    }
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::EncodeXMLValue(
  bool bEncodeCodePointsAboveBasicLatin
) const
{
  const int length0 = this->Length();
  if (length0 <= 0)
    return ON_wString::EmptyString;

  const wchar_t* buffer0 = this->Array();
  if (nullptr == buffer0)
    return ON_wString::EmptyString;
  unsigned hex_digits[8] = {};
  const unsigned hex_digit_capacity = (unsigned)(sizeof(hex_digits) / sizeof(hex_digits[0]));

  const wchar_t* buffer0_end = buffer0 + length0;
  int length1 = 0;
  struct ON_UnicodeErrorParameters e;
  for (const wchar_t* buffer1 = buffer0; buffer1 < buffer0_end; ++buffer1, ++length1)
  {
    const wchar_t c = *buffer1;
    switch (c)
    {
    case ON_UnicodeCodePoint::ON_QuotationMark:
      length1 += 5;
      break;
    case ON_UnicodeCodePoint::ON_Ampersand:
      length1 += 4;
      break;
    case ON_UnicodeCodePoint::ON_Apostrophe:
      length1 += 5;
      break;
    case ON_UnicodeCodePoint::ON_LessThanSign:
      length1 += 3;
      break;
    case ON_UnicodeCodePoint::ON_GreaterThanSign:
      length1 += 3;
      break;
    default:
      if (bEncodeCodePointsAboveBasicLatin && (c < 0 || c > 127))
      {
        e = ON_UnicodeErrorParameters::MaskErrors;
        ON__UINT32 u = ON_UnicodeCodePoint::ON_ReplacementCharacter;
        const int decoded_wchar_count = ON_DecodeWideChar(buffer1, (int)(buffer0_end - buffer1), &e, &u);
        if (decoded_wchar_count > 0 && ON_IsValidUnicodeCodePoint(u))
        {
          const unsigned hex_digit_count = Internal_ToHexDigits(u, hex_digits, hex_digit_capacity);
          if (hex_digit_count > 0)
          {
            length1 += hex_digit_count;
            length1 += 3;
            buffer1 += (decoded_wchar_count-1);
          }
        }
      }
    break;
    }
  }

  if (length1 <= length0)
    return *this; // nothing to encode

  ON_wString s;
  wchar_t* encoded = s.ReserveArray(length1);
  if (nullptr == encoded)
    return ON_wString::EmptyString; // catastrophe

  for (const wchar_t* buffer1 = buffer0; buffer1 < buffer0_end; ++buffer1)
  {
    *encoded = *buffer1;
    switch (*encoded)
    {
    case ON_UnicodeCodePoint::ON_QuotationMark:
      *encoded++ = ON_wString::Ampersand;
      *encoded++ = 'q';
      *encoded++ = 'u';
      *encoded++ = 'o';
      *encoded++ = 't';
      *encoded++ = ON_wString::Semicolon;
      break;

    case ON_UnicodeCodePoint::ON_Ampersand:
      *encoded++ = ON_wString::Ampersand;
      *encoded++ = 'a';
      *encoded++ = 'm';
      *encoded++ = 'p';
      *encoded++ = ON_wString::Semicolon;
      break;

    case ON_UnicodeCodePoint::ON_Apostrophe:
      *encoded++ = ON_wString::Ampersand;
      *encoded++ = 'a';
      *encoded++ = 'p';
      *encoded++ = 'o';
      *encoded++ = 's';
      *encoded++ = ON_wString::Semicolon;
      break;

    case ON_UnicodeCodePoint::ON_LessThanSign:
      *encoded++ = ON_wString::Ampersand;
      *encoded++ = 'l';
      *encoded++ = 't';
      *encoded++ = ON_wString::Semicolon;
      break;

    case ON_UnicodeCodePoint::ON_GreaterThanSign:
      *encoded++ = ON_wString::Ampersand;
      *encoded++ = 'g';
      *encoded++ = 't';
      *encoded++ = ON_wString::Semicolon;
      break;

    default:
      if (bEncodeCodePointsAboveBasicLatin && (*encoded < 0 || *encoded > 127))
      {
        e = ON_UnicodeErrorParameters::MaskErrors;
        ON__UINT32 u = ON_UnicodeCodePoint::ON_ReplacementCharacter;
        const int decoded_wchar_count = ON_DecodeWideChar(buffer1, (int)(buffer0_end - buffer1), &e, &u);
        if (decoded_wchar_count > 0 && ON_IsValidUnicodeCodePoint(u))
        {
          unsigned hex_digit_count = Internal_ToHexDigits(u, hex_digits, hex_digit_capacity);
          if (hex_digit_count > 0)
          {
            *encoded++ = ON_wString::Ampersand;
            *encoded++ = ON_wString::NumberSign;
            *encoded++ = 'x';
            while(hex_digit_count>0)
            {
              --hex_digit_count;
              const unsigned h = hex_digits[hex_digit_count];
              if (h <= 9)
                *encoded++ = (wchar_t)('0' + h);
              else
                *encoded++ = (wchar_t)('a' + (h - 10));
            }
            *encoded = ON_wString::Semicolon;
            buffer1 += (decoded_wchar_count - 1);
          }
        }
      }
      ++encoded;
    }
  }
  *encoded = 0;
  const int encoded_length = (int)(encoded - s.Array());
  if (encoded_length == length1)
  {
    s.SetLength(encoded_length);
    return s;
  }

  return ON_wString::EmptyString; // catastrophe!
}